

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O2

void Qentem::Digit::formatStringNumberFixed<false,Qentem::StringStream<char>>
               (StringStream<char> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool round_up)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool power_increased;
  SizeT index;
  uint local_38;
  SizeT32 local_34;
  
  pcVar1 = stream->storage_;
  uVar6 = stream->length_;
  power_increased = false;
  uVar8 = uVar6 - started_at;
  uVar5 = fraction_length - uVar8;
  if (fraction_length < uVar8) {
    uVar5 = 0;
  }
  index = started_at;
  if (fraction_length != 0) {
    if (precision < uVar5) {
      index = uVar6 - 1;
      pcVar1[index] = '0';
    }
    else {
      uVar7 = fraction_length + started_at;
      uVar3 = (ulong)started_at;
      if (precision < fraction_length) {
        index = ~precision + uVar7;
        local_38 = uVar7;
        local_34 = calculated_digits;
        roundStringNumber<Qentem::StringStream<char>>
                  (stream,&index,&power_increased,uVar8 < fraction_length || round_up);
        uVar6 = stream->length_;
        uVar3 = (ulong)index;
        calculated_digits = local_34;
        uVar7 = local_38;
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          while ((pcVar1 + uVar3 < stream->storage_ + (uVar6 - 1) && (pcVar1[uVar3] == '0'))) {
            uVar3 = uVar3 + 1;
            index = (SizeT)uVar3;
          }
        }
      }
      uVar2 = (uint)uVar3;
      if (uVar8 < fraction_length || uVar8 - fraction_length == 0) {
        if ((uVar2 < uVar6) || (power_increased == true)) {
          if (uVar8 < fraction_length) {
            if (power_increased != false) {
              index = uVar2 - (uVar2 == uVar6);
              pcVar1[index] = '1';
            }
            insertZerosLarge<Qentem::StringStream<char>>(stream,uVar5 - power_increased);
          }
          else if (power_increased != 0) goto LAB_0010de06;
          StringStream<char>::operator+=(stream,'.');
          StringStream<char>::operator+=(stream,'0');
        }
        else {
          index = uVar2 - 1;
          pcVar1[index] = '0';
        }
      }
      else if (uVar2 < uVar7) {
        StringStream<char>::InsertAt(stream,'.',uVar7);
      }
      else {
        iVar4 = uVar8 - fraction_length;
        if (power_increased != true) {
          iVar4 = (uVar2 - started_at) - (uVar8 - calculated_digits);
          if (uVar2 - started_at < uVar8 - calculated_digits) {
            iVar4 = 0;
          }
        }
        while( true ) {
          uVar6 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar6;
          if (iVar4 == 0) break;
          pcVar1[uVar3] = '0';
          iVar4 = iVar4 + -1;
          index = uVar6;
        }
      }
    }
  }
LAB_0010de06:
  StringStream<char>::Reverse(stream,started_at);
  if (index - started_at <= stream->length_) {
    stream->length_ = stream->length_ - (index - started_at);
  }
  return;
}

Assistant:

static void formatStringNumberFixed(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                        const SizeT32 calculated_digits, const SizeT32 fraction_length,
                                        const bool round_up) {
        using Char_T              = typename Stream_T::CharType;
        Char_T     *storage       = stream.Storage();
        const SizeT number_length = (stream.Length() - started_at);
        SizeT       index         = started_at;
        const SizeT dot_index     = SizeT(started_at + fraction_length);
        SizeT32     diff          = ((fraction_length > number_length) ? SizeT32(fraction_length - number_length) : 0);
        bool        power_increased = false;
        const bool  fraction_only   = (number_length <= fraction_length);
        /////////////////////////////////////////////////////
        if (fraction_length != 0) {
            if (diff <= precision) {
                if (fraction_length > precision) {
                    index += SizeT(fraction_length - (precision + SizeT{1}));
                    roundStringNumber(stream, index, power_increased, (round_up | (diff != 0)));

                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }
                }

                if (fraction_only) {
                    if ((index < stream.Length()) || power_increased) {
                        if (diff != 0) {
                            if (power_increased) {
                                index -= SizeT(index == stream.Length());
                                storage[index] = DigitUtils::DigitChar::One;
                            }

                            diff -= SizeT32(power_increased);
                            insertZerosLarge(stream, diff);
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        } else if (!power_increased) {
                            stream += DigitUtils::DigitChar::Dot;
                            stream += DigitUtils::DigitChar::Zero;
                        }
                    } else {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                    }
                } else if (index < dot_index) {
                    stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
                } else {
                    SizeT zeros = 0;

                    if (power_increased) {
                        zeros = SizeT(number_length - fraction_length);
                    } else {
                        const SizeT rem    = (index - started_at);
                        const SizeT needed = SizeT(number_length - calculated_digits);

                        if (rem > needed) {
                            zeros = (rem - needed);
                        }
                    }

                    while (zeros != 0) {
                        --index;
                        storage[index] = DigitUtils::DigitChar::Zero;
                        --zeros;
                    }
                }
            } else {
                index += (number_length - SizeT{1});
                storage[index] = DigitUtils::DigitChar::Zero;
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if QENTEM_CONST_EXPRESSION (Fixed_T) {
            if ((dot_index == index) || ((stream.Length() - started_at) == SizeT{1}) ||
                (!fraction_only && power_increased)) {
                stream += DigitUtils::DigitChar::Dot;
                insertZerosLarge(stream, precision);
            } else if (fraction_only) {
                insertZerosLarge(
                    stream, SizeT32(precision -
                                    SizeT32(stream.Length() - (started_at + SizeT{2})))); // 2 is the length of '0.'.
            } else {
                insertZerosLarge(stream, SizeT32(precision - (dot_index - index)));
            }
        }
    }